

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

MethodDescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>(Arena *arena)

{
  MethodDescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (MethodDescriptorProto *)operator_new(0x40);
    MethodDescriptorProto::MethodDescriptorProto(this);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&MethodDescriptorProto::typeinfo,0x40);
    }
    this = (MethodDescriptorProto *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x40);
    MethodDescriptorProto::MethodDescriptorProto(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}